

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O3

BoundingBox * Assimp::IFC::GetBoundingBox(Polygon *poly)

{
  pointer pIVar1;
  undefined1 auVar2 [16];
  IntPoint *point;
  pointer pIVar3;
  BoundingBox *in_RDI;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  aiVector2t<double> aVar9;
  undefined1 auVar10 [16];
  aiVector2t<double> aVar11;
  
  pIVar3 = (poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  aVar9 = _DAT_006df1b0;
  aVar11 = _DAT_006df1c0;
  if (pIVar3 != pIVar1) {
    dVar4 = -10000000000.0;
    dVar5 = -10000000000.0;
    dVar6 = 10000000000.0;
    dVar7 = 10000000000.0;
    do {
      auVar8._0_8_ = (double)pIVar3->X;
      auVar8._8_8_ = (double)pIVar3->Y;
      auVar10 = divpd(auVar8,_DAT_006e1080);
      auVar10 = maxpd(ZEXT816(0),auVar10);
      auVar8 = minpd(_DAT_006ad2b0,auVar10);
      auVar2._8_8_ = dVar7;
      auVar2._0_8_ = dVar6;
      aVar11 = (aiVector2t<double>)minpd(auVar8,auVar2);
      auVar10._8_8_ = dVar5;
      auVar10._0_8_ = dVar4;
      aVar9 = (aiVector2t<double>)maxpd(auVar8,auVar10);
      pIVar3 = pIVar3 + 1;
      dVar6 = aVar11.x;
      dVar7 = aVar11.y;
      dVar4 = aVar9.x;
      dVar5 = aVar9.y;
    } while (pIVar3 != pIVar1);
  }
  in_RDI->first = aVar11;
  in_RDI->second = aVar9;
  return in_RDI;
}

Assistant:

BoundingBox GetBoundingBox(const ClipperLib::Polygon& poly)
{
    IfcVector2 newbb_min, newbb_max;
    MinMaxChooser<IfcVector2>()(newbb_min, newbb_max);

    for(const ClipperLib::IntPoint& point : poly) {
        IfcVector2 vv = IfcVector2( from_int64(point.X), from_int64(point.Y));

        // sanity rounding
        vv = std::max(vv,IfcVector2());
        vv = std::min(vv,one_vec);

        newbb_min = std::min(newbb_min,vv);
        newbb_max = std::max(newbb_max,vv);
    }
    return BoundingBox(newbb_min, newbb_max);
}